

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.cpp
# Opt level: O2

int __thiscall Polynomial::createMaxMinNode(Polynomial *this,int first_loc,int second_loc,char op)

{
  int iVar1;
  initializer_list<int> __l;
  allocator_type local_59;
  operand local_58;
  vector<int,_std::allocator<int>_> args;
  
  this->mResultLocation =
       (int)((ulong)((long)(this->mEvaluationValues).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->mEvaluationValues).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 2);
  __l._M_len = 2;
  __l._M_array = (iterator)&local_58;
  local_58.op = first_loc;
  local_58._4_4_ = second_loc;
  std::vector<int,_std::allocator<int>_>::vector(&args,__l,&local_59);
  local_58.op = op == '<' | MAX;
  std::vector<int,_std::allocator<int>_>::vector(&local_58.args,&args);
  std::vector<Polynomial::operand,_std::allocator<Polynomial::operand>_>::
  emplace_back<Polynomial::operand>(&this->mOperands,&local_58);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&local_58.args.super__Vector_base<int,_std::allocator<int>_>);
  local_58.op = PLUS;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (&this->mEvaluationValues,(int *)&local_58);
  iVar1 = this->mResultLocation;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&args.super__Vector_base<int,_std::allocator<int>_>);
  return iVar1;
}

Assistant:

int Polynomial::createMaxMinNode(int first_loc, int second_loc, char op)
{
  mResultLocation = mEvaluationValues.size();
  std::vector<int> args { first_loc, second_loc};
  operandType maxmin = (op == MIN_OPERATOR ? operandType::MIN : operandType::MAX);
  mOperands.push_back({maxmin, args});
  mEvaluationValues.push_back(0); // make space in evaluation array for the output.
  return mResultLocation;
}